

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseFalseBranchStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  ParserImpl *in_stack_00000018;
  TokenDetail *in_stack_00000030;
  ParseException *in_stack_00000040;
  ParserImpl *in_stack_000000a8;
  ParserImpl *in_stack_ffffffffffffffc0;
  
  pTVar1 = LookAhead(in_stack_ffffffffffffffc0);
  if (pTVar1->token_ == 0x104) {
    ParseElseIfStatement(in_stack_000000a8);
  }
  else {
    pTVar1 = LookAhead(in_stack_ffffffffffffffc0);
    if (pTVar1->token_ == 0x103) {
      ParseElseStatement(in_stack_00000018);
    }
    else {
      pTVar1 = LookAhead(in_stack_ffffffffffffffc0);
      if (pTVar1->token_ != 0x105) {
        uVar2 = __cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(in_stack_00000040,(char *)this,in_stack_00000030);
        __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
      }
      NextToken(in_stack_ffffffffffffffc0);
      std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
      unique_ptr<std::default_delete<luna::SyntaxTree>,void>
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffffc0);
    }
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFalseBranchStatement()
        {
            if (LookAhead().token_ == Token_Elseif)
                return ParseElseIfStatement();
            else if (LookAhead().token_ == Token_Else)
                return ParseElseStatement();
            else if (LookAhead().token_ == Token_End)
                NextToken();            // skip 'end'
            else
                throw ParseException("expect 'end' for if", look_ahead_);

            return std::unique_ptr<SyntaxTree>();
        }